

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenUtilsEM64T.hpp
# Opt level: O3

Data128 __thiscall Centaurus::pack_charclass(Centaurus *this,CharClass<wchar_t> *cc)

{
  long lVar1;
  int i;
  ulong uVar2;
  short sVar3;
  long lVar4;
  Data128 d128;
  
  lVar1 = 0;
  uVar2 = 0;
  do {
    if (uVar2 < (ulong)((long)cc - (long)this >> 4)) {
      if (*(int *)(this + lVar1 * 8 + 8) == *(int *)(this + lVar1 * 8 + 0xc)) goto LAB_001351b8;
      sVar3 = (short)*(int *)(this + lVar1 * 8 + 0xc) + -1;
      *(short *)((long)&d128 + lVar1 * 2) = (short)*(int *)(this + lVar1 * 8 + 8);
      lVar4 = lVar1;
    }
    else {
LAB_001351b8:
      *(undefined2 *)((long)&d128 + lVar1 * 2) = 0xffff;
      sVar3 = 0;
      lVar4 = uVar2 * 2;
    }
    uVar2 = uVar2 + 1;
    lVar1 = lVar1 + 2;
    *(short *)((long)&d128 + lVar4 * 2 + 2) = sVar3;
    if (uVar2 == 4) {
      return d128;
    }
  } while( true );
}

Assistant:

static asmjit::Data128 pack_charclass(const CharClass<wchar_t>& cc)
{
    asmjit::Data128 d128;

    for (int i = 0; i < 4; i++)
    {
        if (cc[i].empty())
        {
            d128.uw[i * 2 + 0] = 0xFFFF;
            d128.uw[i * 2 + 1] = 0;
        }
        else
        {
            d128.uw[i * 2 + 0] = cc[i].start();
            d128.uw[i * 2 + 1] = cc[i].end() - 1;
        }
    }

    return d128;
}